

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef sload(jit_State *J,int32_t slot)

{
  BCReg BVar1;
  TValue *pTVar2;
  TRef local_3c;
  TRef ref;
  IRType t;
  int32_t slot_local;
  jit_State *J_local;
  uint local_c;
  
  pTVar2 = J->L->base + slot;
  if ((uint)((int)(pTVar2->field_4).it >> 0xf) < 0xfffffff2) {
    local_c = 0xe;
  }
  else {
    local_c = (int)(pTVar2->field_4).it >> 0xf ^ 0xffffffff;
  }
  BVar1 = J->baseslot;
  (J->fold).ins.field_0.ot = (ushort)local_c | 0x4780;
  (J->fold).ins.field_0.op1 = (short)BVar1 + (short)slot;
  (J->fold).ins.field_0.op2 = 4;
  local_3c = lj_ir_emit(J);
  if (local_c < 3) {
    local_3c = local_c * 0xffffff + 0x7fff;
  }
  J->base[slot] = local_3c;
  return local_3c;
}

Assistant:

static TRef sload(jit_State *J, int32_t slot)
{
  IRType t = itype2irt(&J->L->base[slot]);
  TRef ref = emitir_raw(IRTG(IR_SLOAD, t), (int32_t)J->baseslot+slot,
			IRSLOAD_TYPECHECK);
  if (irtype_ispri(t)) ref = TREF_PRI(t);  /* Canonicalize primitive refs. */
  J->base[slot] = ref;
  return ref;
}